

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize_unittest.cc
# Opt level: O2

char * SymbolizeStackConsumption(void *pc,int *stack_consumed)

{
  int iVar1;
  __pid_t _Var2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  SendMethod in_R9;
  LogMessage local_2220;
  stack_t old_sigstk;
  sigaltstack local_21a8;
  sigaction sa;
  sigaction old_sa1;
  sigaction old_sa2;
  char altstack [8096];
  
  g_pc_to_symbolize = pc;
  memset(altstack,0x55,0x1fa0);
  local_21a8.ss_size = 0x1fa0;
  local_21a8.ss_flags = 0;
  local_21a8._12_4_ = 0;
  local_21a8.ss_sp = altstack;
  iVar1 = sigaltstack(&local_21a8,(sigaltstack *)&old_sigstk);
  if (iVar1 == -1) {
    old_sa1.__sigaction_handler.sa_handler = google::LogMessage::SendToLog;
    old_sa1.sa_mask.__val[0] = 0;
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&sa,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/symbolize_unittest.cc"
               ,0xef,FATAL,0,in_R9);
    poVar5 = google::LogMessage::stream((LogMessage *)&sa);
    std::operator<<(poVar5,"sigaltstack(&sigstk, &old_sigstk)");
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&sa);
  }
  memset(&sa,0,0x98);
  sigemptyset((sigset_t *)&sa.sa_mask);
  sa.sa_flags = 0x8000000;
  sa.__sigaction_handler.sa_handler = EmptySignalHandler;
  iVar1 = sigaction(10,(sigaction *)&sa,(sigaction *)&old_sa1);
  if (iVar1 == -1) {
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_2220,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/symbolize_unittest.cc"
               ,0xfa,FATAL,0,in_R9);
    poVar5 = google::LogMessage::stream(&local_2220);
    std::operator<<(poVar5,"sigaction(SIGUSR1, &sa, &old_sa1)");
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_2220);
  }
  sa.__sigaction_handler.sa_handler = SymbolizeSignalHandler;
  iVar1 = sigaction(0xc,(sigaction *)&sa,(sigaction *)&old_sa2);
  if (iVar1 == -1) {
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_2220,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/symbolize_unittest.cc"
               ,0xfe,FATAL,0,in_R9);
    poVar5 = google::LogMessage::stream(&local_2220);
    std::operator<<(poVar5,"sigaction(SIGUSR2, &sa, &old_sa2)");
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_2220);
  }
  _Var2 = getpid();
  iVar1 = kill(_Var2,10);
  if (iVar1 == -1) {
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_2220,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/symbolize_unittest.cc"
               ,0x102,FATAL,0,in_R9);
    poVar5 = google::LogMessage::stream(&local_2220);
    std::operator<<(poVar5,"kill(getpid(), SIGUSR1)");
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_2220);
  }
  iVar1 = GetStackConsumption(altstack);
  _Var2 = getpid();
  iVar3 = kill(_Var2,0xc);
  if (iVar3 == -1) {
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_2220,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/symbolize_unittest.cc"
               ,0x107,FATAL,0,in_R9);
    poVar5 = google::LogMessage::stream(&local_2220);
    std::operator<<(poVar5,"kill(getpid(), SIGUSR2)");
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_2220);
  }
  iVar4 = GetStackConsumption(altstack);
  iVar3 = iVar4 - iVar1;
  if (iVar4 == -1) {
    iVar3 = -1;
  }
  if (iVar1 == -1) {
    iVar3 = -1;
  }
  *stack_consumed = iVar3;
  google::LogMessage::LogMessage
            (&local_2220,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/symbolize_unittest.cc"
             ,0x113);
  poVar5 = google::LogMessage::stream(&local_2220);
  poVar5 = std::operator<<(poVar5,"Stack consumption of empty signal handler: ");
  std::ostream::operator<<(poVar5,iVar1);
  google::LogMessage::~LogMessage(&local_2220);
  google::LogMessage::LogMessage
            (&local_2220,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/symbolize_unittest.cc"
             ,0x115);
  poVar5 = google::LogMessage::stream(&local_2220);
  poVar5 = std::operator<<(poVar5,"Stack consumption of symbolize signal handler: ");
  std::ostream::operator<<(poVar5,iVar4);
  google::LogMessage::~LogMessage(&local_2220);
  google::LogMessage::LogMessage
            (&local_2220,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/symbolize_unittest.cc"
             ,0x117);
  poVar5 = google::LogMessage::stream(&local_2220);
  poVar5 = std::operator<<(poVar5,"Stack consumption of Symbolize: ");
  std::ostream::operator<<(poVar5,*stack_consumed);
  google::LogMessage::~LogMessage(&local_2220);
  iVar1 = sigaltstack((sigaltstack *)&old_sigstk,(sigaltstack *)0x0);
  if (iVar1 == -1) {
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_2220,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/symbolize_unittest.cc"
               ,0x11a,FATAL,0,in_R9);
    poVar5 = google::LogMessage::stream(&local_2220);
    std::operator<<(poVar5,"sigaltstack(&old_sigstk, nullptr)");
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_2220);
  }
  iVar1 = sigaction(10,(sigaction *)&old_sa1,(sigaction *)0x0);
  if (iVar1 == -1) {
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_2220,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/symbolize_unittest.cc"
               ,0x11b,FATAL,0,in_R9);
    poVar5 = google::LogMessage::stream(&local_2220);
    std::operator<<(poVar5,"sigaction(SIGUSR1, &old_sa1, nullptr)");
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_2220);
  }
  iVar1 = sigaction(0xc,(sigaction *)&old_sa2,(sigaction *)0x0);
  if (iVar1 == -1) {
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_2220,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/symbolize_unittest.cc"
               ,0x11c,FATAL,0,in_R9);
    poVar5 = google::LogMessage::stream(&local_2220);
    std::operator<<(poVar5,"sigaction(SIGUSR2, &old_sa2, nullptr)");
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_2220);
  }
  return g_symbolize_result;
}

Assistant:

static const char* SymbolizeStackConsumption(void* pc, int* stack_consumed) {
  g_pc_to_symbolize = pc;

  // The alt-signal-stack cannot be heap allocated because there is a
  // bug in glibc-2.2 where some signal handler setup code looks at the
  // current stack pointer to figure out what thread is currently running.
  // Therefore, the alternate stack must be allocated from the main stack
  // itself.
  char altstack[kAlternateStackSize];
  memset(altstack, kAlternateStackFillValue, kAlternateStackSize);

  // Set up the alt-signal-stack (and save the older one).
  stack_t sigstk;
  memset(&sigstk, 0, sizeof(stack_t));
  stack_t old_sigstk;
  sigstk.ss_sp = altstack;
  sigstk.ss_size = kAlternateStackSize;
  sigstk.ss_flags = 0;
  CHECK_ERR(sigaltstack(&sigstk, &old_sigstk));

  // Set up SIGUSR1 and SIGUSR2 signal handlers (and save the older ones).
  struct sigaction sa;
  memset(&sa, 0, sizeof(struct sigaction));
  struct sigaction old_sa1, old_sa2;
  sigemptyset(&sa.sa_mask);
  sa.sa_flags = SA_ONSTACK;

  // SIGUSR1 maps to EmptySignalHandler.
  sa.sa_handler = EmptySignalHandler;
  CHECK_ERR(sigaction(SIGUSR1, &sa, &old_sa1));

  // SIGUSR2 maps to SymbolizeSignalHanlder.
  sa.sa_handler = SymbolizeSignalHandler;
  CHECK_ERR(sigaction(SIGUSR2, &sa, &old_sa2));

  // Send SIGUSR1 signal and measure the stack consumption of the empty
  // signal handler.
  CHECK_ERR(kill(getpid(), SIGUSR1));
  int stack_consumption1 = GetStackConsumption(altstack);

  // Send SIGUSR2 signal and measure the stack consumption of the symbolize
  // signal handler.
  CHECK_ERR(kill(getpid(), SIGUSR2));
  int stack_consumption2 = GetStackConsumption(altstack);

  // The difference between the two stack consumption values is the
  // stack footprint of the Symbolize function.
  if (stack_consumption1 != -1 && stack_consumption2 != -1) {
    *stack_consumed = stack_consumption2 - stack_consumption1;
  } else {
    *stack_consumed = -1;
  }

  // Log the stack consumption values.
  LOG(INFO) << "Stack consumption of empty signal handler: "
            << stack_consumption1;
  LOG(INFO) << "Stack consumption of symbolize signal handler: "
            << stack_consumption2;
  LOG(INFO) << "Stack consumption of Symbolize: " << *stack_consumed;

  // Now restore the old alt-signal-stack and signal handlers.
  CHECK_ERR(sigaltstack(&old_sigstk, nullptr));
  CHECK_ERR(sigaction(SIGUSR1, &old_sa1, nullptr));
  CHECK_ERR(sigaction(SIGUSR2, &old_sa2, nullptr));

  return g_symbolize_result;
}